

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall wasm::EffectAnalyzer::walk(EffectAnalyzer *this,Expression *ast)

{
  InternalAnalyzer local_f8;
  Expression *local_18;
  Expression *ast_local;
  EffectAnalyzer *this_local;
  
  local_18 = ast;
  ast_local = (Expression *)this;
  InternalAnalyzer::InternalAnalyzer(&local_f8,this);
  Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
  ::walk((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
          *)&local_f8,&local_18);
  InternalAnalyzer::~InternalAnalyzer(&local_f8);
  post(this);
  return;
}

Assistant:

void walk(Expression* ast) {
    InternalAnalyzer(*this).walk(ast);
    post();
  }